

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution2d.cpp
# Opt level: O3

Vec2f __thiscall embree::Distribution2D::sample(Distribution2D *this,Vec2f *u)

{
  Vec2f VVar1;
  uint uVar2;
  uint uVar3;
  float *in_RDX;
  float fVar4;
  float fVar5;
  
  fVar4 = Distribution1D::sample((Distribution1D *)(u + 2),in_RDX[1]);
  uVar3 = (int)u[1].field_0.field_0.x - 1;
  if ((int)fVar4 < (int)uVar3) {
    uVar3 = (int)fVar4;
  }
  uVar2 = 0;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  fVar5 = Distribution1D::sample
                    ((Distribution1D *)((ulong)uVar2 * 0x38 + (long)u[9].field_0),*in_RDX);
  *(float *)&this->width = fVar5;
  *(float *)((long)&this->width + 4) = fVar4;
  VVar1.field_0.field_0.y = 0.0;
  VVar1.field_0.field_0.x = fVar4;
  return (Vec2f)VVar1.field_0;
}

Assistant:

Vec2f Distribution2D::sample(const Vec2f& u) const
  {
    /*! use u.y to sample a row */
    float sy = yDist.sample(u.y);
    int idx = clamp(int(sy),0,int(height)-1);

    /*! use u.x to sample inside the row */
    float sx = xDists[idx].sample(u.x);
    return Vec2f(sx,sy);
  }